

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

int av1_is_leaf_split_partition(AV1_COMMON *cm,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  byte bVar1;
  uint uVar2;
  BLOCK_SIZE BVar3;
  undefined7 in_register_00000009;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [CONCAT71(in_register_00000009,bsize) & 0xffffffff];
  BVar3 = get_partition_subsize(bsize,(PARTITION_TYPE)mi_row);
  uVar2 = 0;
  while ((uVar5 = uVar2, uVar5 != 4 &&
         (iVar4 = (uVar5 >> 1) * (uint)(bVar1 >> 1) + mi_row, iVar4 < (cm->mi_params).mi_rows))) {
    uVar6 = 0;
    if ((uVar5 & 1) != 0) {
      uVar6 = (uint)(bVar1 >> 1);
    }
    if (((cm->mi_params).mi_cols <= (int)(uVar6 + mi_col)) ||
       ((uVar2 = uVar5 + 1, BVar3 != BLOCK_8X8 &&
        ((cm->mi_params).mi_grid_base[(int)(iVar4 * (cm->mi_params).mi_stride + uVar6 + mi_col)]->
         bsize != BVar3)))) break;
  }
  return (int)(3 < uVar5);
}

Assistant:

int av1_is_leaf_split_partition(AV1_COMMON *cm, int mi_row, int mi_col,
                                BLOCK_SIZE bsize) {
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  assert(bsize >= BLOCK_8X8);
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);

  for (int i = 0; i < 4; i++) {
    int x_idx = (i & 1) * hbs;
    int y_idx = (i >> 1) * hbs;
    if ((mi_row + y_idx >= cm->mi_params.mi_rows) ||
        (mi_col + x_idx >= cm->mi_params.mi_cols))
      return 0;
    if (get_partition(cm, mi_row + y_idx, mi_col + x_idx, subsize) !=
            PARTITION_NONE &&
        subsize != BLOCK_8X8)
      return 0;
  }
  return 1;
}